

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<const_Jinx::Variant_&,_const_char_(&)[6]>::streamReconstructedExpression
          (BinaryExpr<const_Jinx::Variant_&,_const_char_(&)[6]> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  char *str;
  string *in_R9;
  StringRef op;
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,Detail::unprintableString_abi_cxx11_,
             DAT_0027dc60 + Detail::unprintableString_abi_cxx11_);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<char[6],void>::convert_abi_cxx11_
            (&local_48,(StringMaker<char[6],void> *)this->m_rhs,str);
  op.m_size = (size_type)&local_48;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)local_68,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }